

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BondOrderParameter.cpp
# Opt level: O2

void __thiscall
OpenMD::BondOrderParameter::writeOrderParameter
          (BondOrderParameter *this,vector<double,_std::allocator<double>_> *Q,
          vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *What)

{
  char cVar1;
  ostream *poVar2;
  mapped_type *pmVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  char *pcVar4;
  char *pcVar5;
  int l;
  long lVar6;
  key_type kVar7;
  key_type kVar8;
  int l_1;
  long lVar9;
  Revision rev;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_458;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_438;
  ofstream osw;
  ofstream osq;
  
  __lhs = &(this->super_StaticAnalyser).outputFilename_;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&osw,__lhs,"q"
                );
  std::ofstream::ofstream(&osq,(char *)_osw,_S_out);
  std::__cxx11::string::~string((string *)&osw);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&osw,__lhs,
                   "q");
    snprintf(painCave.errMsg,2000,"BondOrderParameter: unable to open %s\n",_osw);
    std::__cxx11::string::~string((string *)&osw);
    painCave.isFatal = 1;
    simError();
  }
  else {
    poVar2 = std::operator<<((ostream *)&osq,"# ");
    poVar2 = std::operator<<(poVar2,(string *)&(this->super_StaticAnalyser).analysisType_);
    std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<((ostream *)&osq,"# OpenMD ");
    Revision::getFullRevision_abi_cxx11_((string *)&osw,&rev);
    poVar2 = std::operator<<(poVar2,(string *)&osw);
    std::operator<<(poVar2,"\n");
    std::__cxx11::string::~string((string *)&osw);
    poVar2 = std::operator<<((ostream *)&osq,"# ");
    Revision::getBuildDate_abi_cxx11_((string *)&osw,&rev);
    poVar2 = std::operator<<(poVar2,(string *)&osw);
    std::operator<<(poVar2,"\n");
    std::__cxx11::string::~string((string *)&osw);
    poVar2 = std::operator<<((ostream *)&osq,"# selection script: \"");
    poVar2 = std::operator<<(poVar2,(string *)&this->selectionScript_);
    std::operator<<(poVar2,"\"\n");
    if ((this->super_StaticAnalyser).paramString_._M_string_length != 0) {
      poVar2 = std::operator<<((ostream *)&osq,"# parameters: ");
      poVar2 = std::operator<<(poVar2,(string *)&(this->super_StaticAnalyser).paramString_);
      std::operator<<(poVar2,"\n");
    }
    local_438 = __lhs;
    for (lVar6 = 0; lVar6 != 0xd; lVar6 = lVar6 + 1) {
      poVar2 = std::operator<<((ostream *)&osq,"# <Q_");
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,(int)lVar6);
      std::operator<<(poVar2,">: ");
      poVar2 = std::ostream::_M_insert<double>
                         ((Q->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                          super__Vector_impl_data._M_start[lVar6]);
      std::operator<<(poVar2,"\n");
    }
    kVar8.first = 0;
    kVar8.second = 0;
    for (; (long)kVar8 < (long)this->nBins_; kVar8 = (key_type)((long)kVar8 + 1)) {
      std::ostream::_M_insert<double>(((double)kVar8.first + 0.5) * this->deltaQ_ + this->MinQ_);
      kVar7 = kVar8;
      for (lVar6 = 0; lVar6 != 0xd; lVar6 = lVar6 + 1) {
        std::operator<<((ostream *)&osq,"\t");
        _osw = kVar7;
        pmVar3 = std::
                 map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
                 ::operator[](&this->Q_histogram_,(key_type *)&osw);
        std::ostream::_M_insert<double>
                  (((double)*pmVar3 /
                   (double)(this->Qcount_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[lVar6]) / this->deltaQ_);
        kVar7 = (key_type)((long)kVar7 + 0x100000000);
      }
      std::operator<<((ostream *)&osq,"\n");
    }
    std::ofstream::close();
    __lhs = local_438;
  }
  std::operator+(&local_458,__lhs,"w");
  std::ofstream::ofstream(&osw,local_458._M_dataplus._M_p,_S_out);
  std::__cxx11::string::~string((string *)&local_458);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    std::operator+(&local_458,__lhs,"w");
    snprintf(painCave.errMsg,2000,"BondOrderParameter: unable to open %s\n",
             local_458._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_458);
    painCave.isFatal = 1;
    simError();
  }
  else {
    poVar2 = std::operator<<((ostream *)&osw,"# ");
    poVar2 = std::operator<<(poVar2,(string *)&(this->super_StaticAnalyser).analysisType_);
    std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<((ostream *)&osw,"# OpenMD ");
    Revision::getFullRevision_abi_cxx11_(&local_458,&rev);
    poVar2 = std::operator<<(poVar2,(string *)&local_458);
    std::operator<<(poVar2,"\n");
    std::__cxx11::string::~string((string *)&local_458);
    poVar2 = std::operator<<((ostream *)&osw,"# ");
    Revision::getBuildDate_abi_cxx11_(&local_458,&rev);
    poVar2 = std::operator<<(poVar2,(string *)&local_458);
    std::operator<<(poVar2,"\n");
    std::__cxx11::string::~string((string *)&local_458);
    poVar2 = std::operator<<((ostream *)&osw,"# selection script: \"");
    poVar2 = std::operator<<(poVar2,(string *)&this->selectionScript_);
    std::operator<<(poVar2,"\"\n");
    if ((this->super_StaticAnalyser).paramString_._M_string_length != 0) {
      poVar2 = std::operator<<((ostream *)&osw,"# parameters: ");
      poVar2 = std::operator<<(poVar2,(string *)&(this->super_StaticAnalyser).paramString_);
      std::operator<<(poVar2,"\n");
    }
    lVar6 = 0;
    for (lVar9 = 0; lVar9 != 0xd; lVar9 = lVar9 + 1) {
      poVar2 = std::operator<<((ostream *)&osw,"# <W_");
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,(int)lVar9);
      std::operator<<(poVar2,">: ");
      poVar2 = std::ostream::_M_insert<double>
                         (*(double *)
                           (((What->
                             super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                             )._M_impl.super__Vector_impl_data._M_start)->_M_value + lVar6));
      std::operator<<(poVar2,"\t");
      poVar2 = std::ostream::_M_insert<double>
                         (*(double *)
                           (((What->
                             super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                             )._M_impl.super__Vector_impl_data._M_start)->_M_value + lVar6 + 8));
      std::operator<<(poVar2,"\n");
      lVar6 = lVar6 + 0x10;
    }
    for (pcVar5 = (char *)0x0; (long)pcVar5 < (long)this->nBins_; pcVar5 = pcVar5 + 1) {
      std::ostream::_M_insert<double>(((double)(int)pcVar5 + 0.5) * this->deltaW_ + this->MinW_);
      pcVar4 = pcVar5;
      for (lVar6 = 0; lVar6 != 0xd; lVar6 = lVar6 + 1) {
        std::operator<<((ostream *)&osw,"\t");
        local_458._M_dataplus._M_p = pcVar4;
        pmVar3 = std::
                 map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
                 ::operator[](&this->W_histogram_,(key_type *)&local_458);
        std::ostream::_M_insert<double>
                  (((double)*pmVar3 /
                   (double)(this->Wcount_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[lVar6]) / this->deltaW_);
        pcVar4 = pcVar4 + 0x100000000;
      }
      std::operator<<((ostream *)&osw,"\n");
    }
    std::ofstream::close();
  }
  std::ofstream::~ofstream(&osw);
  std::ofstream::~ofstream(&osq);
  return;
}

Assistant:

void BondOrderParameter::writeOrderParameter(std::vector<RealType> Q,
                                               std::vector<ComplexType> What) {
    Revision rev;
    std::ofstream osq((getOutputFileName() + "q").c_str());

    if (osq.is_open()) {
      osq << "# " << getAnalysisType() << "\n";
      osq << "# OpenMD " << rev.getFullRevision() << "\n";
      osq << "# " << rev.getBuildDate() << "\n";
      osq << "# selection script: \"" << selectionScript_ << "\"\n";
      if (!paramString_.empty())
        osq << "# parameters: " << paramString_ << "\n";

      for (int l = 0; l <= lMax_; l++) {
        osq << "# <Q_" << l << ">: " << Q[l] << "\n";
      }
      // Normalize by number of frames and write it out:
      for (int i = 0; i < nBins_; ++i) {
        RealType Qval = MinQ_ + (i + 0.5) * deltaQ_;
        osq << Qval;
        for (int l = 0; l <= lMax_; l++) {
          osq << "\t"
              << (RealType)Q_histogram_[std::make_pair(i, l)] /
                     (RealType)Qcount_[l] / deltaQ_;
        }
        osq << "\n";
      }

      osq.close();

    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "BondOrderParameter: unable to open %s\n",
               (getOutputFileName() + "q").c_str());
      painCave.isFatal = 1;
      simError();
    }

    std::ofstream osw((getOutputFileName() + "w").c_str());

    if (osw.is_open()) {
      osw << "# " << getAnalysisType() << "\n";
      osw << "# OpenMD " << rev.getFullRevision() << "\n";
      osw << "# " << rev.getBuildDate() << "\n";
      osw << "# selection script: \"" << selectionScript_ << "\"\n";
      if (!paramString_.empty())
        osw << "# parameters: " << paramString_ << "\n";

      for (int l = 0; l <= lMax_; l++) {
        osw << "# <W_" << l << ">: " << real(What[l]) << "\t" << imag(What[l])
            << "\n";
      }
      // Normalize by number of frames and write it out:
      for (int i = 0; i < nBins_; ++i) {
        RealType Wval = MinW_ + (i + 0.5) * deltaW_;
        osw << Wval;
        for (int l = 0; l <= lMax_; l++) {
          osw << "\t"
              << (RealType)W_histogram_[std::make_pair(i, l)] /
                     (RealType)Wcount_[l] / deltaW_;
        }
        osw << "\n";
      }

      osw.close();
    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "BondOrderParameter: unable to open %s\n",
               (getOutputFileName() + "w").c_str());
      painCave.isFatal = 1;
      simError();
    }
  }